

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cc
# Opt level: O0

bool __thiscall ConfigFile::load(ConfigFile *this,string *path)

{
  byte bVar1;
  Stream *pSVar2;
  ssize_t sVar3;
  size_t in_RCX;
  void *__buf;
  allocator<char> local_261;
  string local_260 [32];
  undefined1 local_240 [32];
  ifstream file;
  string *path_local;
  ConfigFile *this_local;
  
  std::ifstream::ifstream(local_240 + 0x18,(string *)path,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_260,"config",&local_261);
    Log::Logger::operator[]((Logger *)local_240,(string *)&Log::Error);
    pSVar2 = Log::Stream::operator<<((Stream *)local_240,"Failed to open config file \'");
    pSVar2 = Log::Stream::operator<<(pSVar2,path);
    Log::Stream::operator<<(pSVar2,"\'");
    Log::Stream::~Stream((Stream *)local_240);
    std::__cxx11::string::~string(local_260);
    std::allocator<char>::~allocator(&local_261);
    this_local._7_1_ = false;
  }
  else {
    sVar3 = read(this,(int)local_240 + 0x18,__buf,in_RCX);
    this_local._7_1_ = (bool)((byte)sVar3 & 1);
  }
  std::ifstream::~ifstream(local_240 + 0x18);
  return this_local._7_1_;
}

Assistant:

bool
ConfigFile::load(const std::string &path) {
  std::ifstream file(path);
  if (!file.is_open()) {
    Log::Error["config"] << "Failed to open config file '" << path << "'";
    return false;
  }

  return read(&file);
}